

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.cpp
# Opt level: O2

DatabaseName * DatabaseName::parse(DatabaseName *__return_storage_ptr__,path *db_base,string *name)

{
  long lVar1;
  runtime_error *this;
  string local_110;
  string local_f0;
  string local_d0;
  string id;
  string type;
  path local_70;
  
  std::__cxx11::string::find((char)name,0x2e);
  lVar1 = std::__cxx11::string::find((char)name,0x2e);
  if (lVar1 != -1) {
    std::__cxx11::string::substr((ulong)&type,(ulong)name);
    std::__cxx11::string::substr((ulong)&id,(ulong)name);
    std::experimental::filesystem::v1::__cxx11::path::path(&local_70,db_base);
    std::__cxx11::string::string((string *)&local_d0,(string *)&type);
    std::__cxx11::string::string((string *)&local_f0,(string *)&id);
    std::__cxx11::string::string((string *)&local_110,(string *)name);
    DatabaseName(__return_storage_ptr__,&local_70,&local_d0,&local_f0,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
    std::__cxx11::string::~string((string *)&id);
    std::__cxx11::string::~string((string *)&type);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Invalid dataset ID found");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

DatabaseName DatabaseName::parse(fs::path db_base, const std::string &name) {
    auto first_dot = name.find('.');
    auto second_dot = name.find('.', first_dot + 1);
    if (second_dot == std::string::npos) {
        throw std::runtime_error("Invalid dataset ID found");
    }
    std::string type = name.substr(0, first_dot);
    std::string id = name.substr(first_dot + 1, second_dot - first_dot - 1);
    return DatabaseName(std::move(db_base), type, id, name);
}